

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O1

uint16_t __thiscall websocketpp::uri::get_port_from_string(uri *this,string *port,error_code *ec)

{
  uint uVar1;
  error_category *peVar2;
  
  peVar2 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar2;
  if (port->_M_string_length == 0) {
    uVar1 = 0x50;
    if (this->m_secure != false) {
      uVar1 = 0x1bb;
    }
  }
  else {
    uVar1 = atoi((port->_M_dataplus)._M_p);
    if (0xffff < uVar1) {
      if (error::get_category()::instance == '\0') {
        get_port_from_string();
      }
      ec->_M_value = 0x18;
      ec->_M_cat = (error_category *)&error::get_category()::instance;
    }
    if (uVar1 == 0) {
      if (error::get_category()::instance == '\0') {
        get_port_from_string();
      }
      ec->_M_value = 0x18;
      ec->_M_cat = (error_category *)&error::get_category()::instance;
    }
  }
  return (uint16_t)uVar1;
}

Assistant:

uint16_t get_port_from_string(std::string const & port, lib::error_code &
        ec) const
    {
        ec = lib::error_code();

        if (port.empty()) {
            return (m_secure ? uri_default_secure_port : uri_default_port);
        }

        unsigned int t_port = static_cast<unsigned int>(atoi(port.c_str()));

        if (t_port > 65535) {
            ec = error::make_error_code(error::invalid_port);
        }

        if (t_port == 0) {
            ec = error::make_error_code(error::invalid_port);
        }

        return static_cast<uint16_t>(t_port);
    }